

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O3

void __thiscall SharedMatting::gathering(SharedMatting *this)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  pointer pvVar9;
  pointer pPVar10;
  pointer pPVar11;
  long lVar12;
  ulong uVar13;
  pointer pvVar14;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  B;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  F;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  double local_120;
  Point local_118;
  Point local_110;
  Point local_108;
  Point local_100;
  vector<Tuple,_std::allocator<Tuple>_> *local_f8;
  ulong local_f0;
  double local_e8;
  double local_e0;
  Point_<int> local_d8;
  Point_<int> local_d0;
  value_type local_c8;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_68;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Sample(this,&local_48,&local_68);
  uVar6 = (uint)((ulong)((long)(this->uT).
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->uT).
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    local_f8 = &this->tuples;
    uVar13 = 0;
    do {
      pvVar9 = local_48.
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar14 = local_68.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar11 = (this->uT).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar1 = pPVar11[uVar13].x;
      iVar2 = pPVar11[uVar13].y;
      local_100.x = iVar1;
      local_100.y = iVar2;
      local_e8 = pfP(this,&local_100,
                     local_48.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13,
                     local_68.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13);
      pPVar11 = pvVar9[uVar13].
                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pPVar11 ==
          pvVar9[uVar13].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
        local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
        local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
        local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
        local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
        local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
        local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
        local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
        local_c8.flag = -1;
      }
      else {
        bVar5 = false;
        local_120 = 10000000000.0;
        local_138 = 0;
        local_13c = 0;
        local_130 = 0;
        local_134 = 0;
        local_f0 = uVar13;
        do {
          pPVar10 = pvVar14[uVar13].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pPVar10 < pvVar14[uVar13].
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            iVar7 = iVar1 - pPVar11->x;
            iVar8 = iVar2 - pPVar11->y;
            local_e0 = SQRT((double)(iVar8 * iVar8 + iVar7 * iVar7));
            do {
              local_d0 = *pPVar11;
              local_d8 = *pPVar10;
              local_108.x = iVar1;
              local_108.y = iVar2;
              dVar4 = gP(this,&local_108,&local_d0,&local_d8,local_e0,local_e8);
              if (dVar4 < local_120) {
                local_13c = pPVar11->x;
                local_138 = pPVar11->y;
                local_134 = pPVar10->x;
                local_130 = pPVar10->y;
                bVar5 = true;
                local_120 = dVar4;
              }
              pPVar10 = pPVar10 + 1;
              pvVar9 = local_48.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar14 = local_68.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (pPVar10 < local_68.
                               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar13].
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          pPVar11 = pPVar11 + 1;
        } while (pPVar11 !=
                 pvVar9[uVar13].
                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
        local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
        local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
        local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
        local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
        local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
        local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
        local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
        local_c8.flag = -1;
        uVar13 = local_f0;
        if (bVar5) {
          puVar3 = this->data;
          lVar12 = (long)(this->channels * local_138 + this->step * local_13c);
          local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (double)puVar3[lVar12 + 2];
          local_c8.flag = 1;
          local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (double)(*(ushort *)(puVar3 + lVar12) & 0xff);
          local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (double)(byte)(*(ushort *)(puVar3 + lVar12) >> 8);
          local_c8.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
          lVar12 = (long)(this->channels * local_130 + this->step * local_134);
          local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (double)puVar3[lVar12 + 2];
          local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (double)(*(ushort *)(puVar3 + lVar12) & 0xff);
          local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (double)(byte)(*(ushort *)(puVar3 + lVar12) >> 8);
          local_c8.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
          local_110.x = local_13c;
          local_110.y = local_138;
          local_c8.sigmaf = sigma2(this,&local_110);
          local_118.x = local_134;
          local_118.y = local_130;
          local_c8.sigmab = sigma2(this,&local_118);
        }
      }
      std::vector<Tuple,_std::allocator<Tuple>_>::push_back(local_f8,&local_c8);
      this->unknownIndex[iVar1][iVar2] = (int)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar6 & 0x7fffffff));
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void SharedMatting::gathering()
{
    vector<Point> f;
    vector<Point> b;
    vector<Point>::iterator it;
    vector<Point>::iterator it1;
    vector<Point>::iterator it2;

    vector<vector<Point> > F,B;


    Sample(F, B);

    int index = 0;
    double a;
    int size = uT.size();

    for (int m = 0; m < size; ++m)
    {
        int i = uT[m].x;
        int j = uT[m].y;

        /*f.clear();
        b.clear();*/

        //sample(Point(i, j), f, b);

        /*double pfp = pfP(Point(i, j), f, b);*/

        double pfp = pfP(Point(i, j), F[m], B[m]);
        double gmin = 1.0e10;

        Point tf;
        Point tb;

        bool flag = false;
        bool first = true;

        for (it1 = F[m].begin(); it1 != F[m].end(); ++it1)
        {
            double dpf = dP(Point(i, j), *(it1));
            for (it2 = B[m].begin(); it2 < B[m].end(); ++it2)
            {

                double gp = gP(Point(i, j), *(it1), *(it2), dpf, pfp);
                if (gp < gmin)
                {
                    gmin = gp;
                    tf   = *(it1);
                    tb   = *(it2);
                    flag = true;
                }
            }
        }

        struct Tuple st;
        st.flag = -1;
        if (flag)
        {
            int bc, gc, rc;
            bc = data[tf.x * step +  tf.y * channels];
            gc = data[tf.x * step +  tf.y * channels + 1];
            rc = data[tf.x * step +  tf.y * channels + 2];
            st.flag   = 1;
            st.f      = Scalar(bc, gc, rc);
            bc = data[tb.x * step +  tb.y * channels];
            gc = data[tb.x * step +  tb.y * channels + 1];
            rc = data[tb.x * step +  tb.y * channels + 2];
            st.b      = Scalar(bc, gc, rc);
            st.sigmaf = sigma2(tf);
            st.sigmab = sigma2(tb);
        }

        tuples.push_back(st);
        unknownIndex[i][j] = index;
        ++index;
    }
    f.clear();
    b.clear();

}